

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

void __thiscall nnad::Matrix<double>::Display(Matrix<double> *this)

{
  ostream *poVar1;
  double dVar2;
  int local_30;
  int local_2c;
  
  local_2c = 0;
  if (0 < this->_Lines) {
    do {
      local_30 = 0;
      if (0 < this->_Columns) {
        do {
          dVar2 = GetElement(this,&local_2c,&local_30);
          poVar1 = std::ostream::_M_insert<double>(dVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
          local_30 = local_30 + 1;
        } while (local_30 < this->_Columns);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
      local_2c = local_2c + 1;
    } while (local_2c < this->_Lines);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return;
}

Assistant:

void Display()
    {
      for (int i = 0; i < _Lines; i++)
        {
          for (int j = 0; j < _Columns; j++)
            std::cout << this->GetElement(i,j) << " ";
          std::cout << std::endl;
        }
      std::cout << std::endl;
    }